

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O2

QStyleOptionToolBox * qstyleoption_cast<QStyleOptionToolBox_const*>(QStyleOption *opt)

{
  if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 7)) {
    opt = (QStyleOption *)0x0;
  }
  return (QStyleOptionToolBox *)opt;
}

Assistant:

T qstyleoption_cast(const QStyleOption *opt)
{
    typedef typename std::remove_cv<typename std::remove_pointer<T>::type>::type Opt;
    if (opt && opt->version >= Opt::Version && (opt->type == Opt::Type
        || int(Opt::Type) == QStyleOption::SO_Default
        || (int(Opt::Type) == QStyleOption::SO_Complex
            && opt->type > QStyleOption::SO_Complex)))
        return static_cast<T>(opt);
    return nullptr;
}